

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

quaternion * quaternion_set_from_axis_anglef3(quaternion *self,float x,float y,float z,float angle)

{
  quaternion *pqVar1;
  float fVar2;
  double dVar3;
  float c;
  float s;
  float angle_local;
  float z_local;
  float y_local;
  float x_local;
  quaternion *self_local;
  
  dVar3 = sin((double)(angle / 2.0));
  fVar2 = (float)dVar3;
  dVar3 = cos((double)(angle / 2.0));
  (self->field_0).q[0] = x * fVar2;
  (self->field_0).q[1] = y * fVar2;
  (self->field_0).q[2] = z * fVar2;
  (self->field_0).q[3] = (float)dVar3;
  pqVar1 = quaternion_normalize(self);
  return pqVar1;
}

Assistant:

HYPAPI struct quaternion *quaternion_set_from_axis_anglef3(struct quaternion *self, HYP_FLOAT x, HYP_FLOAT y, HYP_FLOAT z, HYP_FLOAT angle)
{
	HYP_FLOAT s = HYP_SIN(angle / 2.0f);
	HYP_FLOAT c = HYP_COS(angle / 2.0f);

	self->x = x * s;
	self->y = y * s;
	self->z = z * s;
	self->w = c;

	/* reduce rounding errors caused by sin/cos */
	return quaternion_normalize(self);
}